

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall SVGChart::PPlot::~PPlot(PPlot *this)

{
  (this->super_PDrawer)._vptr_PDrawer = (_func_int **)&PTR__PPlot_00111770;
  if ((this->mOwnsPPlotDrawer == true) && (this->mPPlotDrawer != (PDrawer *)0x0)) {
    (*this->mPPlotDrawer->_vptr_PDrawer[1])();
  }
  NamedTickIterator::~NamedTickIterator(&this->mXNamedTickIterator);
  LinTickIterator::~LinTickIterator(&this->mYLinTickIterator);
  LinTickIterator::~LinTickIterator(&this->mXLinTickIterator);
  std::_Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::~_Vector_base
            (&(this->mPostDrawerList).
              super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>);
  std::_Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::~_Vector_base
            (&(this->mPreDrawerList).
              super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>);
  std::_Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::
  ~_Vector_base(&(this->mPostCalculatorList).
                 super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
               );
  std::_Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::
  ~_Vector_base(&(this->mModifyingCalculatorList).
                 super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
               );
  PlotBackground::~PlotBackground(&this->mPlotBackground);
  AxisSetup::~AxisSetup(&this->mYAxisSetup);
  AxisSetup::~AxisSetup(&this->mXAxisSetup);
  PlotDataContainer::~PlotDataContainer(&this->mPlotDataContainer);
  return;
}

Assistant:

PPlot::~PPlot () {
      if (mOwnsPPlotDrawer) {
        delete mPPlotDrawer;
      }
    }